

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# media.cpp
# Opt level: O2

string * __thiscall
pbrt::HGPhaseFunction::ToString_abi_cxx11_(string *__return_storage_ptr__,HGPhaseFunction *this)

{
  float *in_RCX;
  
  StringPrintf<float_const&>
            (__return_storage_ptr__,(pbrt *)"[ HGPhaseFunction g: %f ]",(char *)this,in_RCX);
  return __return_storage_ptr__;
}

Assistant:

std::string HGPhaseFunction::ToString() const {
    return StringPrintf("[ HGPhaseFunction g: %f ]", g);
}